

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Batchnorm.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeBatchnorm(ConvertLayerParameters layerParameters)

{
  RepeatedPtrFieldBase *this;
  RepeatedField<float> *this_00;
  int *this_01;
  RepeatedField<float> *this_02;
  RepeatedField<float> *this_03;
  string *psVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  ActivationReLU *pAVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  size_t __n;
  bool bVar8;
  int iVar9;
  int iVar10;
  Type *caffeLayer;
  Type *pTVar11;
  LogMessage *pLVar12;
  Type *pTVar13;
  Type *this_04;
  BatchnormLayerParams *this_05;
  WeightParams *pWVar14;
  WeightParams *pWVar15;
  WeightParams *pWVar16;
  LayerUnion LVar17;
  float *pfVar18;
  ScaleParameter *pSVar19;
  Type *pTVar20;
  Type *pTVar21;
  uint uVar22;
  uint uVar23;
  BatchNormParameter *pBVar24;
  ulong uVar25;
  RepeatedPtrField<caffe::BlobProto> *this_06;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  RepeatedField<float> variance;
  RepeatedField<float> mean;
  RepeatedField<float> beta;
  RepeatedField<float> gamma;
  string TopName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  float local_364;
  LayerUnion local_360;
  undefined1 local_358 [56];
  undefined1 local_320 [56];
  RepeatedField<float> local_2e8;
  RepeatedField<float> local_2d8;
  undefined1 local_2c8 [16];
  RepeatedField<float> local_2b8;
  RepeatedField<float> local_2a8;
  value_type local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  int *local_238;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_230;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_238 = in_stack_00000048;
  iVar10 = *in_stack_00000048;
  this = (RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70);
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (this,iVar10);
  local_230 = in_stack_00000030;
  iVar9 = getLayerIndex(caffeLayer,in_stack_00000030);
  local_360.convolution_ = (ConvolutionLayerParams *)(in_stack_00000010 + 0x70);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)local_360.convolution_,iVar9);
  local_2c8._0_8_ = in_stack_00000028;
  local_2c8._0_8_ = in_stack_00000028;
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Must have 1 input and 1 output","");
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
  }
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  plVar2 = (long *)((caffeLayer->top_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  lVar3 = *plVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_298,lVar3,plVar2[1] + lVar3);
  local_2a8.current_size_ = 0;
  local_2a8.total_size_ = 0;
  local_2a8.rep_ = (Rep *)0x0;
  local_2b8.current_size_ = 0;
  local_2b8.total_size_ = 0;
  local_2b8.rep_ = (Rep *)0x0;
  if (iVar10 < *(int *)(in_stack_00000008 + 0x78) + -1) {
    pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                        (this,iVar10 + 1);
    iVar9 = std::__cxx11::string::compare((char *)(pTVar13->type_).ptr_);
    if (iVar9 == 0) {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (this,iVar10 + 1);
      bVar8 = false;
      if (((pTVar13->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
         ((pTVar13->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) goto LAB_003e42de;
      if ((pTVar13->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar12 = google::protobuf::internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      puVar6 = (undefined8 *)((pTVar13->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar12 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
      }
      puVar7 = (undefined8 *)((caffeLayer->top_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      __n = puVar6[1];
      if ((__n == puVar7[1]) &&
         ((__n == 0 || (iVar10 = bcmp((void *)*puVar6,(void *)*puVar7,__n), iVar10 == 0)))) {
        pSVar19 = pTVar13->scale_param_;
        if (pSVar19 == (ScaleParameter *)0x0) {
          pSVar19 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
        }
        if ((((pSVar19->axis_ == 1) || (pSVar19->axis_ == -3)) && (pSVar19->num_axes_ == 1)) &&
           (pSVar19->bias_term_ == true)) {
          iVar10 = getLayerIndex(pTVar13,local_230);
          pTVar20 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              ((RepeatedPtrFieldBase *)local_360,iVar10);
          if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ == 2) {
            this_06 = &pTVar20->blobs_;
            pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this_06->super_RepeatedPtrFieldBase,0);
            iVar10 = (pTVar21->data_).current_size_;
            pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this_06->super_RepeatedPtrFieldBase,1);
            iVar9 = (pTVar21->data_).current_size_;
            pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&(pTVar11->blobs_).super_RepeatedPtrFieldBase,0);
            if ((pTVar21->data_).current_size_ == (uint)(iVar10 == iVar9)) {
              google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pTVar13->top_).super_RepeatedPtrFieldBase,0);
              std::__cxx11::string::_M_assign((string *)&local_298);
              pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&this_06->super_RepeatedPtrFieldBase,0);
              google::protobuf::RepeatedField<float>::operator=(&local_2a8,&pTVar21->data_);
              pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&this_06->super_RepeatedPtrFieldBase,1);
              google::protobuf::RepeatedField<float>::operator=(&local_2b8,&pTVar21->data_);
              *local_238 = *local_238 + 1;
              bVar8 = true;
              goto LAB_003e42de;
            }
          }
        }
      }
    }
  }
  bVar8 = false;
LAB_003e42de:
  this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_258,
              (value_type *)((caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_278,&local_298);
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&local_258,&local_278,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c8._0_8_);
  if (this_04->_oneof_case_[0] != 0xa0) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_04);
    this_04->_oneof_case_[0] = 0xa0;
    this_05 = (BatchnormLayerParams *)operator_new(0x48);
    CoreML::Specification::BatchnormLayerParams::BatchnormLayerParams(this_05);
    (this_04->layer_).batchnorm_ = this_05;
  }
  pBVar24 = caffeLayer->batch_norm_param_;
  if (pBVar24 == (BatchNormParameter *)0x0) {
    pBVar24 = (BatchNormParameter *)&caffe::_BatchNormParameter_default_instance_;
  }
  LVar17 = this_04->layer_;
  local_360 = LVar17;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ != 3) {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Must have 3 weight blobs for mean, variance and scale","");
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    LVar17 = local_360;
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  uVar23 = *(uint *)((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  uVar25 = (ulong)uVar23;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  uVar22 = *(uint *)(*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18);
  if (uVar23 == 0) {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"Empty mean vector blob","")
    ;
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    LVar17 = local_360;
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
  }
  if (uVar22 == 0) {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Empty variance vector blob","");
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    LVar17 = local_360;
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
  }
  if (uVar22 != uVar23) {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Lengths of mean/variance vectors do not match","");
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    LVar17 = local_360;
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      LVar17 = local_360;
    }
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  if (*(int *)((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] + 0x18) == 0)
  {
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Empty scale factor blob","");
    psVar1 = (caffeLayer->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"BatchNorm","");
    errorInCaffeProto((string *)local_358,psVar1,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
  }
  (LVar17.pooling_)->type_ = (int)pBVar24->eps_;
  if ((int)uVar23 < 0) {
    __assert_fail("C >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Batchnorm.cpp"
                  ,0x80,
                  "void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  (LVar17.batchnorm_)->channels_ = uVar25;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  pvVar4 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0];
  if (*(int *)((long)pvVar4 + 0x18) < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  local_2c8 = ZEXT416(*(uint *)(*(long *)((long)pvVar4 + 0x20) + 8));
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_320,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_320,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_358,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_320);
  }
  pvVar4 = ((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  local_2d8.current_size_ = 0;
  local_2d8.total_size_ = 0;
  local_2d8.rep_ = (Rep *)0x0;
  if (*(int *)((long)pvVar4 + 0x18) != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&local_2d8,*(int *)((long)pvVar4 + 0x18));
    memcpy((local_2d8.rep_)->elements,(void *)(*(long *)((long)pvVar4 + 0x20) + 8),
           (long)*(int *)((long)pvVar4 + 0x18) << 2);
    local_2d8.current_size_ = *(int *)((long)pvVar4 + 0x18);
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_358,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_358,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_364,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_358);
  }
  lVar3 = *(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  local_2e8.current_size_ = 0;
  local_2e8.total_size_ = 0;
  local_2e8.rep_ = (Rep *)0x0;
  if (*(int *)(lVar3 + 0x18) != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&local_2e8,*(int *)(lVar3 + 0x18));
    memcpy((local_2e8.rep_)->elements,(void *)(*(long *)(lVar3 + 0x20) + 8),
           (long)*(int *)(lVar3 + 0x18) << 2);
    local_2e8.current_size_ = *(int *)(lVar3 + 0x18);
  }
  if ((LVar17.innerproduct_)->inputchannels_ == 0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    (LVar17.batchnorm_)->mean_ = pWVar14;
  }
  pWVar14 = (LVar17.batchnorm_)->mean_;
  if ((LVar17.innerproduct_)->outputchannels_ == 0) {
    pWVar15 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar15);
    (local_360.batchnorm_)->variance_ = pWVar15;
    LVar17 = local_360;
  }
  pWVar15 = (LVar17.batchnorm_)->variance_;
  if (((LVar17.activation_)->NonlinearityType_).linear_ == (ActivationLinear *)0x0) {
    pWVar16 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar16);
    ((local_360.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar16;
    LVar17 = local_360;
  }
  pAVar5 = ((LVar17.activation_)->NonlinearityType_).relu_;
  if ((LVar17.innerproduct_)->bias_ == (WeightParams *)0x0) {
    pWVar16 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar16);
    (local_360.innerproduct_)->bias_ = pWVar16;
    LVar17 = local_360;
  }
  this_00 = &pWVar14->floatvalue_;
  pWVar16 = (LVar17.innerproduct_)->bias_;
  if (this_00->current_size_ < (int)uVar23) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,uVar23);
    uVar22 = this_00->current_size_;
    if (uVar22 != uVar23) {
      memset(((pWVar14->floatvalue_).rep_)->elements + (int)uVar22,0,
             uVar25 * 4 + (long)(int)uVar22 * -4);
    }
  }
  this_03 = &pWVar15->floatvalue_;
  this_00->current_size_ = uVar23;
  if (this_03->current_size_ < (int)uVar23) {
    google::protobuf::RepeatedField<float>::Reserve(this_03,uVar23);
    uVar22 = this_03->current_size_;
    if (uVar22 != uVar23) {
      memset(((pWVar15->floatvalue_).rep_)->elements + (int)uVar22,0,
             uVar25 * 4 + (long)(int)uVar22 * -4);
    }
  }
  this_01 = &pAVar5->_cached_size_;
  this_03->current_size_ = uVar23;
  if (*this_01 < (int)uVar23) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)this_01,uVar23);
    uVar22 = *this_01;
    if (uVar22 != uVar23) {
      memset((void *)((long)pAVar5[1].super_MessageLite._vptr_MessageLite +
                     (long)(int)uVar22 * 4 + 8),0,uVar25 * 4 + (long)(int)uVar22 * -4);
    }
  }
  this_02 = &pWVar16->floatvalue_;
  *this_01 = uVar23;
  if (this_02->current_size_ < (int)uVar23) {
    google::protobuf::RepeatedField<float>::Reserve(this_02,uVar23);
    uVar22 = this_02->current_size_;
    if (uVar22 != uVar23) {
      memset(((pWVar16->floatvalue_).rep_)->elements + (int)uVar22,0,
             uVar25 * 4 + (long)(int)uVar22 * -4);
    }
  }
  this_02->current_size_ = uVar23;
  if (uVar23 != 0) {
    local_2c8 = ZEXT416(~-(uint)((float)local_2c8._0_4_ < 1e-05) &
                        (uint)(1.0 / (float)local_2c8._0_4_));
    uVar22 = 1;
    if (1 < (int)uVar23) {
      uVar22 = uVar23;
    }
    uVar23 = 0;
    do {
      pfVar18 = google::protobuf::RepeatedField<float>::Mutable(&local_2d8,uVar23);
      local_364 = *pfVar18 * (float)local_2c8._0_4_;
      google::protobuf::RepeatedField<float>::Set(this_00,uVar23,&local_364);
      pfVar18 = google::protobuf::RepeatedField<float>::Mutable(&local_2e8,uVar23);
      local_364 = *pfVar18 * (float)local_2c8._0_4_;
      google::protobuf::RepeatedField<float>::Set(this_03,uVar23,&local_364);
      if (bVar8) {
        pfVar18 = google::protobuf::RepeatedField<float>::Mutable(&local_2a8,uVar23);
        google::protobuf::RepeatedField<float>::Set((RepeatedField<float> *)this_01,uVar23,pfVar18);
        pfVar18 = google::protobuf::RepeatedField<float>::Mutable(&local_2b8,uVar23);
        google::protobuf::RepeatedField<float>::Set(this_02,uVar23,pfVar18);
      }
      else {
        local_364 = 1.0;
        google::protobuf::RepeatedField<float>::Set
                  ((RepeatedField<float> *)this_01,uVar23,&local_364);
        local_364 = 0.0;
        google::protobuf::RepeatedField<float>::Set(this_02,uVar23,&local_364);
      }
      uVar23 = uVar23 + 1;
    } while (uVar22 != uVar23);
  }
  if ((local_2e8.rep_ != (Rep *)0x0) && ((local_2e8.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_2e8.rep_,(long)local_2e8.total_size_ * 4 + 8);
  }
  if ((local_2d8.rep_ != (Rep *)0x0) && ((local_2d8.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_2d8.rep_,(long)local_2d8.total_size_ * 4 + 8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  if ((local_2b8.rep_ != (Rep *)0x0) && ((local_2b8.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_2b8.rep_,(long)local_2b8.total_size_ * 4 + 8);
  }
  if ((local_2a8.rep_ != (Rep *)0x0) && ((local_2a8.rep_)->arena == (Arena *)0x0)) {
    operator_delete(local_2a8.rep_,(long)local_2a8.total_size_ * 4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     If Batchnorm layer is followed by a Scale layer, we try to fuse the two into 1 CoreML Batchnorm layer (its more efficient).
     */
    
    bool fuseScale = false;
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),"BatchNorm");
    }
    
    std::string TopName = caffeLayer.top(0);
    ::google::protobuf::RepeatedField<float> gamma;
    ::google::protobuf::RepeatedField<float> beta;
    /*
     Check whether Scale layer is to be fused: several conditions must be satisfied
     */
    //check whether the current BN is not the last layer and that the next layer is a "Scale" layer
    if (layerId < layerParameters.prototxt.layer_size()-1 && layerParameters.prototxt.layer(layerId+1).type() == "Scale"){
        const caffe::LayerParameter& caffeScaleLayer = layerParameters.prototxt.layer(layerId+1);
        
        //check whether the Scale layer has 1 bottom and top. Its bottom must be same as BN layer's top,
        //so that we know for sure that they are connected.
        if (caffeScaleLayer.bottom_size() == 1 && caffeScaleLayer.top_size() == 1 &&
            caffeScaleLayer.bottom(0) == caffeLayer.top(0)){
            
            const caffe::ScaleParameter& caffeLayerParamsScale = caffeScaleLayer.scale_param();
            
            //check that the Scale layer only applies scale to the channel axis and that it also includes the bias term.
            if ((caffeLayerParamsScale.axis() == 1 || caffeLayerParamsScale.axis() == -3) &&
                caffeLayerParamsScale.num_axes() == 1 && caffeLayerParamsScale.bias_term()){
                
                int layerIdWeightsScale = CoreMLConverter::getLayerIndex(caffeScaleLayer,layerParameters.mapCaffeLayerNamesToIndex);
                const caffe::LayerParameter& caffeScaleLayerWeights = layerParameters.protoweights.layer(layerIdWeightsScale);
                
                //check that the weights proto message corresponding to the scale layer is correct
                if (caffeScaleLayerWeights.blobs_size() == 2 &&
                    caffeScaleLayerWeights.blobs(0).data_size() == caffeScaleLayerWeights.blobs(1).data_size()
                    == caffeLayerWeights.blobs(0).data_size()){
                    
                    //All conditions are satisfied: Scale layer can now be fused with the BN layer.
                    fuseScale = true;
                    TopName = caffeScaleLayer.top(0);
                    gamma = caffeScaleLayerWeights.blobs(0).data();
                    beta = caffeScaleLayerWeights.blobs(1).data();
                    (*layerParameters.layerId)++;
                    //Succesfully fused batchNorm and scale layers.
                    
                }
            }
        }
    }
    
    #pragma unused(gamma)
    #pragma unused(beta)
    
    //Write Layer metadata
    ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    bottom.push_back(caffeLayer.bottom(0));
    top.push_back(TopName);
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::BatchnormLayerParams* specLayerParams = specLayer->mutable_batchnorm();
    const caffe::BatchNormParameter& caffeLayerParamsBN = caffeLayer.batch_norm_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()!=3) {
        CoreMLConverter::errorInCaffeProto("Must have 3 weight blobs for mean, variance and scale",caffeLayer.name(),"BatchNorm");
    }
    if (!caffeLayerParamsBN.use_global_stats()){
        /*
         WARNING: BatchNorm paramater 'use_global_stats' is False. It will be ignored during inference.
        The converter will look for mean/variance weights anyways. If they are not found, it will error out.
        */
    }
    //***************************************************************
    
    int C = caffeLayerWeights.blobs(0).data_size();
    int varianceLength = caffeLayerWeights.blobs(1).data_size();
    
    //****Some error checking in caffe file*************************
    if (C == 0){
        CoreMLConverter::errorInCaffeProto("Empty mean vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength == 0){
        CoreMLConverter::errorInCaffeProto("Empty variance vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength != C){
        CoreMLConverter::errorInCaffeProto("Lengths of mean/variance vectors do not match",caffeLayer.name(),"BatchNorm");
    }
    if (caffeLayerWeights.blobs(2).data_size() == 0){
        CoreMLConverter::errorInCaffeProto("Empty scale factor blob",caffeLayer.name(),"BatchNorm");
    }
    //***************************************************************
    
    specLayerParams->set_epsilon(caffeLayerParamsBN.eps());
    assert(C >= 0);
    specLayerParams->set_channels(static_cast<uint64_t>(C));
    float scale = caffeLayerWeights.blobs(2).data(0);
    float multiplicativeScale = (scale < 1e-5f) ? 0 : 1/scale;
    ::google::protobuf::RepeatedField<float> mean = caffeLayerWeights.blobs(0).data();
    ::google::protobuf::RepeatedField<float> variance = caffeLayerWeights.blobs(1).data();
    ::google::protobuf::RepeatedField<float>* meanWrite = specLayerParams->mutable_mean()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* varianceWrite = specLayerParams->mutable_variance()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* gammaWrite = specLayerParams->mutable_gamma()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* betaWrite = specLayerParams->mutable_beta()->mutable_floatvalue();
    meanWrite->Resize(C, 0.0);
    varianceWrite->Resize(C, 0.0);
    gammaWrite->Resize(C, 0.0);
    betaWrite->Resize(C, 0.0);
    for (int i=0; i<C; i++){
        meanWrite->Set(i,mean[i] * multiplicativeScale);
        varianceWrite->Set(i,variance[i] * multiplicativeScale);
        if (fuseScale){
            gammaWrite->Set(i, gamma[i]);
            betaWrite->Set(i, beta[i]);
        } else{
            gammaWrite->Set(i,1.0);
            betaWrite->Set(i,0.0);
        }
    }
}